

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

bool __thiscall Minisat::Solver::enqueue(Solver *this,Lit p,CRef from)

{
  bool bVar1;
  undefined4 in_ESI;
  Solver *in_RDI;
  CRef in_stack_00000030;
  lbool *in_stack_ffffffffffffffb8;
  lbool in_stack_ffffffffffffffc7;
  Lit in_stack_ffffffffffffffd0;
  lbool local_25;
  undefined4 local_24;
  uint8_t local_1e;
  lbool local_1d [8];
  uint8_t local_15;
  undefined4 local_4;
  
  local_4 = in_ESI;
  local_15 = (uint8_t)value(in_RDI,in_stack_ffffffffffffffd0);
  lbool::lbool(local_1d,'\x02');
  bVar1 = lbool::operator!=(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc7);
  if (bVar1) {
    local_24 = local_4;
    local_1e = (uint8_t)value(in_RDI,in_stack_ffffffffffffffd0);
    lbool::lbool(&local_25,'\x01');
    bVar1 = lbool::operator!=(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc7);
  }
  else {
    decisionLevel((Solver *)0x160044);
    uncheckedEnqueue(this,p,from,in_stack_00000030);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

inline bool Solver::enqueue(Lit p, CRef from)
{
    return value(p) != l_Undef ? value(p) != l_False : (uncheckedEnqueue(p, decisionLevel(), from), true);
}